

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O1

void free_master_msg(EVmaster_msg *msg)

{
  leaf_element *plVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  if (msg->msg_type == DFGnode_join) {
    free((msg->u).node_join.node_name);
    free((msg->u).node_join.contact_string);
    if (0 < (msg->u).node_join.sink_count) {
      lVar4 = 8;
      lVar3 = 0;
      do {
        plVar1 = (msg->u).node_join.sinks;
        pvVar2 = *(void **)((long)plVar1 + lVar4 + -8);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
        pvVar2 = *(void **)((long)&plVar1->name + lVar4);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
        lVar3 = lVar3 + 1;
        lVar4 = lVar4 + 0x10;
      } while (lVar3 < (msg->u).node_join.sink_count);
    }
    free((msg->u).node_join.sinks);
    lVar4 = 0x30;
    if (0 < (msg->u).node_join.source_count) {
      lVar5 = 8;
      lVar3 = 0;
      do {
        plVar1 = (msg->u).node_join.sources;
        pvVar2 = *(void **)((long)plVar1 + lVar5 + -8);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
        pvVar2 = *(void **)((long)&plVar1->name + lVar5);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
        lVar3 = lVar3 + 1;
        lVar5 = lVar5 + 0x10;
      } while (lVar3 < (msg->u).node_join.source_count);
    }
  }
  else {
    if (msg->msg_type != DFGflush_reconfig) goto LAB_0014665c;
    lVar4 = 0x20;
    if (0 < (msg->u).flush_reconfig.count) {
      lVar5 = 8;
      lVar3 = 0;
      do {
        free(*(void **)((long)&((msg->u).flush_reconfig.attr_stone_list)->stone + lVar5));
        lVar3 = lVar3 + 1;
        lVar5 = lVar5 + 0x10;
      } while (lVar3 < (msg->u).flush_reconfig.count);
    }
  }
  free(*(void **)((long)&msg->msg_type + lVar4));
LAB_0014665c:
  free(msg);
  return;
}

Assistant:

static void
free_master_msg(EVmaster_msg *msg)
{
    switch(msg->msg_type) {
    case DFGnode_join: {
	EVnode_join_ptr in = &msg->u.node_join;
	int i;
	free(in->node_name);
	free(in->contact_string);
	for (i=0; i < in->sink_count; i++) {
	    leaf_element *l = &in->sinks[i];
	    if(l->name) free(l->name);
	    if(l->FMtype) free(l->FMtype);
	}
	free(in->sinks);
	for (i=0; i < in->source_count; i++) {
	    leaf_element *l = &in->sources[i];
	    if (l->name) free(l->name);
	    if (l->FMtype) free(l->FMtype);
	}
	free(in->sources);
	break;
    }
    case DFGflush_reconfig: {
	EVflush_attrs_reconfig_ptr in = &msg->u.flush_reconfig;
	int i;
	for (i=0 ; i < in->count; i++) {
	    free(in->attr_stone_list[i].attr_str);
	}
	free(in->attr_stone_list);
	break;
    }
    case DFGdeploy_ack:
    case DFGshutdown_contrib:
    case DFGconn_shutdown:
    default:
	break;
    }
    free(msg);
}